

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O2

void * wrapped_dlsym(char *prefix,char *name)

{
  char *in_RAX;
  void *pvVar1;
  char *wrap_name;
  char *local_18;
  
  local_18 = in_RAX;
  asprintf(&local_18,"override_%s_%s",prefix,name);
  pvVar1 = dlwrap_real_dlsym((void *)0x0,local_18);
  free(local_18);
  return pvVar1;
}

Assistant:

static void *
wrapped_dlsym(const char *prefix, const char *name)
{
    char *wrap_name;
    void *symbol;

    asprintf(&wrap_name, "override_%s_%s", prefix, name);
    symbol = dlwrap_real_dlsym(RTLD_DEFAULT, wrap_name);
    free(wrap_name);
    return symbol;
}